

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_PlayerKeys(FParser *this)

{
  char *type;
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  if (this->t_argc < 2) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  uVar1 = T_GetPlayerNum(this->t_argv);
  if (uVar1 != 0xffffffff) {
    uVar2 = intvalue(this->t_argv + 1);
    if (5 < uVar2) {
      script_error("key number out of range: %i\n",(ulong)uVar2);
      return;
    }
    type = SF_PlayerKeys::DoomKeys[uVar2];
    if (this->t_argc == 2) {
      (this->t_return).type = 1;
      iVar3 = FS_CheckInventory((AActor *)(&players)[(ulong)uVar1 * 0x54],type);
      (this->t_return).value.i = iVar3;
    }
    else {
      iVar3 = intvalue(this->t_argv + 2);
      if (iVar3 == 0) {
        FS_TakeInventory((AActor *)(&players)[(ulong)uVar1 * 0x54],type,1);
      }
      else {
        FS_GiveInventory((AActor *)(&players)[(ulong)uVar1 * 0x54],type,1);
      }
      (this->t_return).type = 1;
      (this->t_return).value.i = 0;
    }
  }
  return;
}

Assistant:

void FParser::SF_PlayerKeys(void)
{
	static const char * const DoomKeys[]={"BlueCard", "YellowCard", "RedCard", "BlueSkull", "YellowSkull", "RedSkull"};
	int  playernum, keynum, givetake;
	const char * keyname;
	
	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) return;
		
		keynum = intvalue(t_argv[1]);
		if(keynum < 0 || keynum >= 6)
		{
			script_error("key number out of range: %i\n", keynum);
			return;
		}
		keyname=DoomKeys[keynum];
		
		if(t_argc == 2)
		{
			t_return.type = svt_int;
			t_return.value.i = FS_CheckInventory(players[playernum].mo, keyname);
			return;
		}
		else
		{
			givetake = intvalue(t_argv[2]);
			if(givetake) FS_GiveInventory(players[playernum].mo, keyname, 1);
			else FS_TakeInventory(players[playernum].mo, keyname, 1);
			t_return.type = svt_int;
			t_return.value.i = 0;
		}
	}
}